

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzparse.c
# Opt level: O1

int_fast32_t transtime(int year,rule *rulep,int_fast32_t offset)

{
  rule_t rVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  
  iVar3 = _PDCLIB_is_leap(year);
  rVar1 = rulep->type;
  if (rVar1 == MONTH_NTH_DAY_OF_WEEK) {
    iVar2 = rulep->mon;
    iVar6 = iVar2 + 9;
    iVar9 = year - (uint)((long)iVar2 < 3);
    iVar4 = (int)((ulong)((long)iVar9 * -0x51eb851f) >> 0x20);
    iVar5 = (iVar4 >> 5) - (iVar4 >> 0x1f);
    iVar8 = iVar9 % 100;
    iVar4 = iVar9 % 100 + 3;
    if (-1 < iVar8) {
      iVar4 = iVar8;
    }
    iVar6 = iVar9 / 400 + iVar8 + (iVar4 >> 2) +
            (int)((iVar6 + (((uint)(iVar6 / 6 + (iVar6 >> 0x1f)) >> 1) - (iVar6 >> 0x1f)) * -0xc) *
                  0x1a + 0x18) / 10;
    iVar4 = iVar6 + iVar5 * 2;
    iVar5 = (int)((ulong)((long)(iVar6 + iVar5 * 2 + 1) * -0x6db6db6d) >> 0x20) + iVar4 + 1;
    iVar5 = ((iVar5 >> 2) - (iVar5 >> 0x1f)) * -7;
    iVar6 = iVar5 + iVar4 + 1;
    iVar4 = iVar5 + 8 + iVar4;
    if (-1 < iVar6) {
      iVar4 = iVar6;
    }
    iVar4 = rulep->day - iVar4;
    iVar5 = rulep->week;
    iVar6 = iVar4 + 7;
    if (-1 < iVar4) {
      iVar6 = iVar4;
    }
    iVar4 = iVar6;
    if (1 < iVar5) {
      iVar9 = iVar5 + -1;
      iVar8 = iVar6;
      do {
        iVar4 = iVar8;
        if (*(int *)(&UNK_0010ce7c + (long)iVar2 * 4 + (ulong)((uint)(iVar3 != 0) * 0x30)) <=
            iVar8 + 7) break;
        iVar9 = iVar9 + -1;
        iVar4 = iVar5 * 7 + iVar6 + -7;
        iVar8 = iVar8 + 7;
      } while (iVar9 != 0);
    }
    iVar4 = iVar4 * 0x15180;
    if (1 < iVar2) {
      uVar7 = 0;
      do {
        iVar4 = iVar4 + mon_lengths[iVar3 != 0][uVar7] * 0x15180;
        uVar7 = uVar7 + 1;
      } while (iVar2 - 1 != uVar7);
    }
  }
  else if (rVar1 == DAY_OF_YEAR) {
    iVar4 = rulep->day * 0x15180;
  }
  else {
    iVar4 = 0;
    if (rVar1 == JULIAN_DAY) {
      iVar4 = rulep->day * 0x15180;
      iVar2 = iVar4 + -0x15180;
      if (rulep->day < 0x3c) {
        iVar4 = iVar2;
      }
      if (iVar3 == 0) {
        iVar4 = iVar2;
      }
    }
  }
  return iVar4 + offset + rulep->time;
}

Assistant:

static int_fast32_t transtime( const int year, struct rule const * rulep, const int_fast32_t offset )
{
    bool         leapyear;
    int_fast32_t value = 0;
    int          i;
    int          d;
    int          m1;
    int          yy0;
    int          yy1;
    int          yy2;
    int          dow;

    leapyear = _PDCLIB_is_leap( year );

    switch ( rulep->type )
    {
        case JULIAN_DAY:
            /* Jn - Julian day, 1 == January 1, 60 == March 1 even in leap
               years.
               In non-leap years, or if the day number is 59 or less, just
               add SECSPERDAY times the day number-1 to the time of
               January 1, midnight, to get the day.
            */
            value = ( rulep->day - 1 ) * SECSPERDAY;

            if ( leapyear && rulep->day >= 60 )
            {
                value += SECSPERDAY;
            }

            break;

        case DAY_OF_YEAR:
            /* n - day of year.
               Just add SECSPERDAY times the day number to the time of
               January 1, midnight, to get the day.
            */
            value = rulep->day * SECSPERDAY;
            break;

        case MONTH_NTH_DAY_OF_WEEK:
            /* Mm.n.d - nth "dth day" of month m.  */

            /* Use Zeller's Congruence to get day-of-week of first day of
               month.
            */
            m1 = ( rulep->mon + 9 ) % 12 + 1;
            yy0 = ( rulep->mon <= 2 ) ? ( year - 1 ) : year;
            yy1 = yy0 / 100;
            yy2 = yy0 % 100;
            dow = ( ( 26 * m1 - 2 ) / 10 + 1 + yy2 + yy2 / 4 + yy1 / 4 - 2 * yy1 ) % 7;

            if ( dow < 0 )
            {
                dow += DAYSPERWEEK;
            }

            /* "dow" is the day-of-week of the first day of the month. Get
               the day-of-month (zero-origin) of the first "dow" day of the
               month.
            */
            d = rulep->day - dow;

            if ( d < 0 )
            {
                d += DAYSPERWEEK;
            }

            for ( i = 1; i < rulep->week; ++i )
            {
                if ( d + DAYSPERWEEK >= mon_lengths[ leapyear ][ rulep->mon - 1 ] )
                {
                    break;
                }

                d += DAYSPERWEEK;
            }

            /* "d" is the day-of-month (zero-origin) of the day we want. */
            value = d * SECSPERDAY;

            for ( i = 0; i < rulep->mon - 1; ++i )
            {
                value += mon_lengths[ leapyear ][ i ] * SECSPERDAY;
            }

            break;
    }

    /* "value" is the year-relative time of 00:00:00 UT on the day in
       question. To get the year-relative time of the specified local
       time on that day, add the transition time and the current offset
       from UT.
    */
    return value + rulep->time + offset;
}